

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O0

void device_reset_c219(void *chip)

{
  undefined4 *puVar1;
  C219_VOICE *v;
  int i;
  c219_state *info;
  void *chip_local;
  
  memset((void *)((long)chip + 0x20),0,0x200);
  for (v._4_4_ = 0; v._4_4_ < 0x10; v._4_4_ = v._4_4_ + 1) {
    puVar1 = (undefined4 *)((long)chip + (long)v._4_4_ * 0x1c + 0x424);
    *(undefined2 *)(puVar1 + 1) = 0;
    *puVar1 = 0;
  }
  *(undefined2 *)((long)chip + 0x220) = 0x1234;
  return;
}

Assistant:

static void device_reset_c219(void *chip)
{
	c219_state *info = (c219_state *)chip;
	int i;
	
	memset(info->REG, 0, sizeof(info->REG));
	
	for(i = 0; i < MAX_VOICE; i ++)
	{
		C219_VOICE *v = &info->voi[i];
		
		v->pofs = 0;
		v->pos = 0;
	}
	
	// init noise generator
	info->random = 0x1234;
	
	return;
}